

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropCommandBase.cxx
# Opt level: O2

bool __thiscall
cmTargetPropCommandBase::ProcessContentArgs
          (cmTargetPropCommandBase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,uint *argIndex,bool prepend,bool system)

{
  pointer pbVar1;
  cmTargetPropCommandBase *this_00;
  bool bVar2;
  TargetType TVar3;
  int iVar4;
  undefined7 in_register_00000009;
  undefined1 uVar5;
  uint uVar6;
  ulong uVar7;
  undefined7 in_register_00000081;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  content;
  allocator<char> local_81;
  string local_80;
  undefined4 local_60;
  undefined4 local_5c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  cmTargetPropCommandBase *local_38;
  
  local_5c = (undefined4)CONCAT71(in_register_00000081,system);
  local_60 = (undefined4)CONCAT71(in_register_00000009,prepend);
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start + *argIndex;
  bVar2 = std::operator!=(pbVar8,"PUBLIC");
  if (((bVar2) && (bVar2 = std::operator!=(pbVar8,"PRIVATE"), bVar2)) &&
     (bVar2 = std::operator!=(pbVar8,"INTERFACE"), bVar2)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"called with invalid arguments",(allocator<char> *)&local_58);
    SetError(this,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    return false;
  }
  uVar6 = *argIndex + 1;
  *argIndex = uVar6;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_40 = pbVar8;
  local_38 = this;
  while( true ) {
    uVar7 = (ulong)uVar6;
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar7)
    break;
    bVar2 = std::operator==(pbVar1 + uVar7,"PUBLIC");
    if (((bVar2) ||
        (bVar2 = std::operator==((args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + uVar7,"PRIVATE"),
        bVar2)) ||
       (bVar2 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar7,"INTERFACE"),
       bVar2)) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_58,
                (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + uVar7);
    uVar6 = uVar6 + 1;
    *argIndex = *argIndex + 1;
  }
  this_00 = local_38;
  pbVar8 = local_40;
  if (local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00334c08:
    iVar4 = (*this_00->_vptr_cmTargetPropCommandBase[3])
                      (this_00,pbVar8,&local_58,(ulong)(byte)local_60,(ulong)(byte)local_5c);
    uVar5 = (undefined1)iVar4;
  }
  else {
    TVar3 = cmTarget::GetType(local_38->Target);
    if (((TVar3 == INTERFACE_LIBRARY) && (bVar2 = std::operator!=(pbVar8,"INTERFACE"), bVar2)) &&
       (bVar2 = std::operator!=(&this_00->Property,"SOURCES"), bVar2)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"may only set INTERFACE properties on INTERFACE targets",
                 &local_81);
      SetError(this_00,&local_80);
    }
    else {
      bVar2 = cmTarget::IsImported(this_00->Target);
      if ((bVar2) && (bVar2 = std::operator!=(pbVar8,"INTERFACE"), bVar2)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_80,"may only set INTERFACE properties on IMPORTED targets",
                   &local_81);
        SetError(this_00,&local_80);
      }
      else {
        TVar3 = cmTarget::GetType(this_00->Target);
        if ((TVar3 != UTILITY) || (bVar2 = std::operator!=(pbVar8,"PRIVATE"), !bVar2))
        goto LAB_00334c08;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_80,"may only set PRIVATE properties on custom targets",&local_81
                  );
        SetError(this_00,&local_80);
      }
    }
    std::__cxx11::string::~string((string *)&local_80);
    uVar5 = 0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  return (bool)uVar5;
}

Assistant:

bool cmTargetPropCommandBase::ProcessContentArgs(
  std::vector<std::string> const& args, unsigned int& argIndex, bool prepend,
  bool system)
{
  std::string const& scope = args[argIndex];

  if (scope != "PUBLIC" && scope != "PRIVATE" && scope != "INTERFACE") {
    this->SetError("called with invalid arguments");
    return false;
  }

  ++argIndex;

  std::vector<std::string> content;

  for (unsigned int i = argIndex; i < args.size(); ++i, ++argIndex) {
    if (args[i] == "PUBLIC" || args[i] == "PRIVATE" ||
        args[i] == "INTERFACE") {
      break;
    }
    content.push_back(args[i]);
  }
  if (!content.empty()) {
    if (this->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY &&
        scope != "INTERFACE" && this->Property != "SOURCES") {
      this->SetError("may only set INTERFACE properties on INTERFACE targets");
      return false;
    }
    if (this->Target->IsImported() && scope != "INTERFACE") {
      this->SetError("may only set INTERFACE properties on IMPORTED targets");
      return false;
    }
    if (this->Target->GetType() == cmStateEnums::UTILITY &&
        scope != "PRIVATE") {
      this->SetError("may only set PRIVATE properties on custom targets");
      return false;
    }
  }
  return this->PopulateTargetProperties(scope, content, prepend, system);
}